

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  Rep *pRVar1;
  void **ppvVar2;
  
  if (start < 0) {
    RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  }
  else if (-1 < num) {
    if (num + start <= (this->super_RepeatedPtrFieldBase).current_size_) {
      if (num != 0) {
        if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0) {
          ppvVar2 = (void **)this;
          if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
            pRVar1 = protobuf::internal::RepeatedPtrFieldBase::rep
                               (&this->super_RepeatedPtrFieldBase);
            ppvVar2 = pRVar1->elements;
          }
          memcpy(elements,ppvVar2 + (uint)start,(ulong)(uint)num << 3);
        }
        protobuf::internal::RepeatedPtrFieldBase::CloseGap
                  (&this->super_RepeatedPtrFieldBase,start,num);
        return;
      }
      return;
    }
    goto LAB_0095001e;
  }
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
LAB_0095001e:
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}